

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void * worker_thread(void *thread_func_param)

{
  byte *pbVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  ushort uVar5;
  _func_void_ptr_mg_context_ptr_int *p_Var6;
  socket *psVar7;
  code *pcVar8;
  size_t sVar9;
  _func_void_mg_context_ptr_int_void_ptr *p_Var10;
  double dVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  bool bVar19;
  char cVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  void *pvVar24;
  time_t tVar25;
  ushort **ppuVar26;
  ulong uVar27;
  size_t sVar28;
  char *pcVar29;
  ptrdiff_t pVar30;
  size_t __n;
  longlong lVar31;
  int *piVar32;
  tm *__tp;
  uint in_ECX;
  long lVar33;
  long lVar34;
  __int32_t *p_Var35;
  Elf64_Ehdr *mcx;
  char cVar36;
  uint uVar37;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *func;
  mg_context *ctx;
  char *func_00;
  time_t *t;
  mg_file_stat *extraout_RDX_02;
  char *func_01;
  mg_file_stat *extraout_RDX_03;
  mg_file_stat *extraout_RDX_04;
  mg_file_stat *filep;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  byte *pbVar38;
  mg_http_method_info *pmVar39;
  char *pcVar40;
  uint uVar41;
  pthread_cond_t *__cond;
  mg_header *pmVar42;
  char *pcVar43;
  char *pcVar44;
  ulong uVar45;
  mg_connection *pmVar46;
  char *pcVar47;
  char *pcVar48;
  pthread_mutex_t *__mutex;
  char *pcVar49;
  int iVar50;
  mg_context *ctx_00;
  bool bVar51;
  bool bVar52;
  mg_connection *conn;
  int local_4284;
  mg_header *local_4280;
  int local_4274;
  __int32_t **local_4270;
  mg_file file;
  mg_handler_info *handler_info;
  usa *local_4228;
  mg_request_handler callback_handler;
  int local_4214;
  size_t local_4210;
  char *local_4208;
  void *auth_callback_data;
  mg_authorization_handler auth_handler;
  void *callback_data;
  char mult;
  undefined7 uStack_41e7;
  size_t local_41e0;
  pthread_mutex_t *local_41d8;
  time_t *local_41d0;
  pthread_cond_t *local_41c8;
  pthread_mutex_t *local_41c0;
  mg_context *local_41b8;
  undefined8 *local_41b0;
  char *local_41a8;
  pthread_cond_t *local_41a0;
  time_t curtime;
  mg_websocket_close_handler ws_close_handler;
  mg_websocket_data_handler ws_data_handler;
  mg_websocket_ready_handler ws_ready_handler;
  mg_websocket_connect_handler ws_connect_handler;
  vec filename_vec;
  undefined4 local_4160 [2];
  char *local_4158;
  void *local_4150;
  char *local_4148;
  mg_websocket_subprotocols *subprotocols;
  char ebuf [100];
  sigaction sa;
  char *portend;
  size_t local_4030;
  vec val;
  char local_1039;
  char path [4096];
  
  pvVar24 = (void *)0x0;
  memset(&sa,0,0x98);
  sa.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  sigaction(0xd,(sigaction *)&sa,(sigaction *)0x0);
  ctx_00 = *(mg_context **)((long)thread_func_param + 0x8e0);
  mg_set_thread_name("worker");
  local_4160[0] = 0;
  LOCK();
  UNLOCK();
  local_4158 = (char *)(ulong)((int)thread_idx_max + 1);
  thread_idx_max = thread_idx_max + 1;
  pthread_setspecific(sTlsKey,local_4160);
  p_Var6 = (ctx_00->callbacks).init_thread;
  pcVar47 = extraout_RDX;
  if (p_Var6 != (_func_void_ptr_mg_context_ptr_int *)0x0) {
    pvVar24 = (*p_Var6)(ctx_00,1);
    pcVar47 = extraout_RDX_00;
  }
  uVar41 = (int)((ulong)((long)thread_func_param - (long)ctx_00->worker_connections) >> 3) *
           0x6f71de15;
  local_4150 = pvVar24;
  if (((int)uVar41 < 0) || (ctx_00->cfg_worker_threads <= uVar41)) {
    pcVar44 = "Internal error: Invalid worker index %i";
  }
  else {
    uVar22 = ctx_00->max_request_size;
    pvVar24 = malloc((ulong)uVar22);
    *(void **)((long)thread_func_param + 0x970) = pvVar24;
    if (pvVar24 != (void *)0x0) {
      *(uint *)((long)thread_func_param + 0x990) = uVar22;
      *(mg_domain_context **)((long)thread_func_param + 0x8e8) = &ctx_00->dd;
      *(void **)((long)thread_func_param + 0x9e0) = local_4150;
      *(void **)((long)thread_func_param + 0x90) = ctx_00->user_data;
      iVar21 = pthread_mutex_init((pthread_mutex_t *)((long)thread_func_param + 0x9b8),
                                  (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar21 != 0) {
        free(*(void **)((long)thread_func_param + 0x970));
        mg_cry_internal_wrap((mg_connection *)0x0,ctx_00,func,in_ECX,"%s","Cannot create mutex");
        return (void *)0x0;
      }
      local_41b0 = (undefined8 *)((long)thread_func_param + 0x8f8);
      local_41c0 = (pthread_mutex_t *)&ctx_00->thread_mutex;
      local_41c8 = (pthread_cond_t *)&ctx_00->sq_full;
      local_41a0 = (pthread_cond_t *)&ctx_00->sq_empty;
      local_41d0 = (time_t *)((long)thread_func_param + 0x938);
      local_4228 = (usa *)((long)thread_func_param + 0x918);
      local_41a8 = (char *)((long)thread_func_param + 0x48);
      puVar2 = (undefined8 *)((long)thread_func_param + 0x10);
      local_4280 = (mg_header *)((long)thread_func_param + 0xa8);
      __cond = local_41c8;
      __mutex = local_41c0;
      local_41d8 = (pthread_mutex_t *)((long)thread_func_param + 0x9b8);
      local_41b8 = ctx_00;
LAB_00115556:
      do {
        pthread_mutex_lock(__mutex);
        while ((ctx_00->sq_head == ctx_00->sq_tail && (ctx_00->stop_flag == 0))) {
          pthread_cond_wait(__cond,__mutex);
        }
        if (ctx_00->sq_tail < ctx_00->sq_head) {
          psVar7 = ctx_00->squeue;
          iVar21 = ctx_00->sq_tail % ctx_00->sq_size;
          uVar14 = *(undefined8 *)(psVar7 + iVar21);
          uVar15 = *(undefined8 *)((long)&psVar7[iVar21].lsa + 4);
          puVar3 = (undefined8 *)((long)&psVar7[iVar21].lsa + 0xc);
          uVar12 = *puVar3;
          uVar13 = puVar3[1];
          uVar16 = *(undefined8 *)&psVar7[iVar21].rsa;
          uVar17 = *(undefined8 *)((long)&psVar7[iVar21].rsa + 8);
          puVar3 = (undefined8 *)((long)&psVar7[iVar21].rsa + 0x10);
          uVar18 = puVar3[1];
          local_41b0[6] = *puVar3;
          local_41b0[7] = uVar18;
          local_41b0[4] = uVar16;
          local_41b0[5] = uVar17;
          local_41b0[2] = uVar12;
          local_41b0[3] = uVar13;
          *local_41b0 = uVar14;
          local_41b0[1] = uVar15;
          ctx_00->sq_tail = ctx_00->sq_tail + 1;
          iVar21 = ctx_00->sq_size;
          while (iVar21 < ctx_00->sq_tail) {
            ctx_00->sq_tail = ctx_00->sq_tail - iVar21;
            ctx_00->sq_head = ctx_00->sq_head - iVar21;
          }
        }
        pthread_cond_signal(local_41a0);
        pthread_mutex_unlock(__mutex);
        if (ctx_00->stop_flag != 0) {
          p_Var10 = (ctx_00->callbacks).exit_thread;
          if (p_Var10 != (_func_void_mg_context_ptr_int_void_ptr *)0x0) {
            (*p_Var10)(ctx_00,1,local_4150);
          }
          pthread_setspecific(sTlsKey,(void *)0x0);
          pthread_mutex_destroy(local_41d8);
          *(undefined4 *)((long)thread_func_param + 0x990) = 0;
          free(*(void **)((long)thread_func_param + 0x970));
          *(undefined8 *)((long)thread_func_param + 0x970) = 0;
          if (*(void **)((long)thread_func_param + 0x28) ==
              *(void **)((long)thread_func_param + 0x20)) {
            return (void *)0x0;
          }
          free(*(void **)((long)thread_func_param + 0x28));
          *(undefined8 *)((long)thread_func_param + 0x28) = 0;
          return (void *)0x0;
        }
        local_4148 = (char *)0x0;
        tVar25 = time((time_t *)0x0);
        *(time_t *)((long)thread_func_param + 0x938) = tVar25;
        *(uint *)((long)thread_func_param + 0x80) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x91a) << 8 |
                           *(ushort *)((long)thread_func_param + 0x91a) >> 8);
        *(uint *)((long)thread_func_param + 0x84) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                           *(ushort *)((long)thread_func_param + 0x8fe) >> 8);
        sockaddr_to_string(local_41a8,0x30,local_4228);
        *(uint *)((long)thread_func_param + 0x88) = (uint)*(byte *)((long)thread_func_param + 0x934)
        ;
      } while (*(byte *)((long)thread_func_param + 0x934) != 0);
      lVar34 = *(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x58);
      local_4270 = __ctype_tolower_loc();
      lVar33 = 0;
      do {
        bVar4 = *(byte *)(lVar34 + lVar33);
        iVar21 = (*local_4270)[bVar4];
        iVar23 = (*local_4270)[(byte)"yes"[lVar33]];
        if (bVar4 == 0) break;
        lVar33 = lVar33 + 1;
      } while (iVar21 == iVar23);
      if (iVar21 != iVar23) {
        *(undefined4 *)((long)thread_func_param + 0x980) = 1;
      }
      *(undefined4 *)((long)thread_func_param + 0x998) = 0;
      *(undefined4 *)((long)thread_func_param + 0x98c) = 0;
      *(undefined4 *)thread_func_param = 0;
      *(undefined8 *)((long)thread_func_param + 0x4b0) = 0;
      *(undefined8 *)((long)thread_func_param + 0x98) = 0;
      pcVar8 = *(code **)(*(int **)((long)thread_func_param + 0x8e0) + 0xa0e6);
      if ((pcVar8 != (code *)0x0) && (**(int **)((long)thread_func_param + 0x8e0) == 1)) {
        portend = (char *)0x0;
        (*pcVar8)(thread_func_param,&portend);
        *(char **)((long)thread_func_param + 0x98) = portend;
      }
      *(undefined8 *)thread_func_param = 1;
LAB_00115761:
      *(undefined4 *)thread_func_param = 1;
      iVar21 = get_message((mg_connection *)thread_func_param,ebuf,100,&local_4284);
      pmVar42 = local_4280;
      if (iVar21 != 0) {
        pbVar38 = *(byte **)((long)thread_func_param + 0x970);
        iVar21 = *(int *)((long)thread_func_param + 0x990);
        *(undefined8 *)((long)thread_func_param + 0x30) = 0;
        *(undefined8 *)((long)thread_func_param + 0x40) = 0;
        *(undefined4 *)((long)thread_func_param + 0xa0) = 0;
        *puVar2 = 0;
        *(undefined8 *)((long)thread_func_param + 0x18) = 0;
        if ((long)iVar21 < 1) {
          iVar23 = 0;
        }
        else {
          portend = (char *)pbVar38;
          ppuVar26 = __ctype_b_loc();
          lVar34 = 0;
          iVar50 = iVar21;
          do {
            if ((*(byte *)((long)*ppuVar26 + (ulong)pbVar38[lVar34] * 2 + 1) & 0x20) == 0) {
              pbVar38 = pbVar38 + lVar34;
              iVar23 = (int)lVar34;
              iVar21 = iVar50;
              goto LAB_0011581a;
            }
            iVar50 = iVar50 + -1;
            lVar34 = lVar34 + 1;
          } while ((int)lVar34 != iVar21);
          pbVar38 = pbVar38 + iVar21;
          iVar23 = iVar21;
          iVar21 = 0;
        }
LAB_0011581a:
        portend = (char *)pbVar38;
        if (((iVar21 != 0) && (ppuVar26 = __ctype_b_loc(), ((*ppuVar26)[*pbVar38] & 2) == 0)) &&
           (uVar41 = get_http_header_len((char *)pbVar38,iVar21), 0 < (int)uVar41)) {
          pbVar38[(ulong)uVar41 - 1] = 0;
          if ((0xd < *pbVar38) || ((0x2401U >> (*pbVar38 & 0x1f) & 1) == 0)) {
            *puVar2 = pbVar38;
            iVar21 = skip_to_end_of_word_and_terminate(&portend,0);
            if (0 < iVar21) {
              *(char **)((long)thread_func_param + 0x18) = portend;
              iVar21 = skip_to_end_of_word_and_terminate(&portend,0);
              if (0 < iVar21) {
                *(char **)((long)thread_func_param + 0x30) = portend;
                iVar21 = skip_to_end_of_word_and_terminate(&portend,1);
                if (0 < iVar21) {
                  pcVar47 = *(char **)((long)thread_func_param + 0x30);
                  iVar21 = strncmp(pcVar47,"HTTP/",5);
                  if (iVar21 == 0) {
                    *(char **)((long)thread_func_param + 0x30) = pcVar47 + 5;
                    pcVar47 = *(char **)((long)thread_func_param + 0x10);
                    pmVar39 = http_methods;
                    pcVar44 = "GET";
                    do {
                      pmVar39 = pmVar39 + 1;
                      iVar21 = strcmp(pcVar44,pcVar47);
                      if (iVar21 == 0) {
                        iVar21 = parse_http_headers(&portend,pmVar42);
                        *(int *)((long)thread_func_param + 0xa0) = iVar21;
                        if ((-1 < iVar21) && (0 < (int)(uVar41 + iVar23))) {
                          pcVar47 = get_header(pmVar42,iVar21,"Host");
                          if (pcVar47 == (char *)0x0) {
LAB_00116789:
                            pcVar47 = (char *)0x0;
                            pcVar44 = (char *)0x0;
                          }
                          else if (*pcVar47 == '[') {
                            pcVar44 = strchr(pcVar47,0x5d);
                            if (pcVar44 == (char *)0x0) goto LAB_00116789;
                            pcVar44 = pcVar44 + (1 - (long)pcVar47);
                          }
                          else {
                            pcVar44 = strchr(pcVar47,0x3a);
                            if (pcVar44 == (char *)0x0) {
                              pcVar44 = (char *)strlen(pcVar47);
                            }
                            else {
                              pcVar44 = pcVar44 + -(long)pcVar47;
                            }
                          }
                          if (pcVar47 == (char *)0x0) goto LAB_001168fa;
                          if (*(long *)((long)thread_func_param + 0x8f0) == 0) {
                            lVar34 = *(long *)((long)thread_func_param + 0x8e0) + 0x283a8;
                            goto LAB_00116865;
                          }
                          pcVar29 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8);
                          if (((pcVar29 == (char *)0x0) ||
                              (*(long *)((long)thread_func_param + 0x8e8) ==
                               *(long *)((long)thread_func_param + 0x8e0) + 0x283a8)) ||
                             ((pcVar40 = (char *)strlen(pcVar29), pcVar40 == pcVar44 &&
                              (iVar21 = mg_strncasecmp(pcVar47,pcVar29,(size_t)pcVar44), iVar21 == 0
                              )))) goto LAB_001168fa;
                          pcVar47 = "Bad request: Host mismatch";
                          goto LAB_00115894;
                        }
                        break;
                      }
                      pcVar44 = pmVar39->name;
                    } while (pcVar44 != (char *)0x0);
                  }
                }
              }
            }
          }
        }
        pcVar47 = "Bad request";
LAB_00115894:
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s",pcVar47);
        local_4284 = 400;
      }
      goto LAB_001158aa;
    }
    pcVar44 = "Out of memory: Cannot allocate buffer for worker %i";
    pcVar47 = extraout_RDX_01;
  }
  mg_cry_internal_wrap((mg_connection *)0x0,ctx_00,pcVar47,in_ECX,pcVar44,(ulong)uVar41);
  return (void *)0x0;
  while( true ) {
    pcVar29 = *(char **)(lVar34 + 0xf8);
    pcVar40 = (char *)strlen(pcVar29);
    if ((pcVar40 == pcVar44) &&
       (iVar21 = mg_strncasecmp(pcVar47,pcVar29,(size_t)pcVar44), iVar21 == 0)) {
      *(long *)((long)thread_func_param + 0x8e8) = lVar34;
      bVar51 = false;
    }
    else {
      piVar32 = *(int **)((long)thread_func_param + 0x8e0);
      if ((piVar32 != (int *)0x0) && (*piVar32 == 1)) {
        pthread_mutex_lock((pthread_mutex_t *)(piVar32 + 0xa0ba));
      }
      lVar34 = *(long *)(lVar34 + 0x1f8);
      piVar32 = *(int **)((long)thread_func_param + 0x8e0);
      bVar51 = true;
      if ((piVar32 != (int *)0x0) && (*piVar32 == 1)) {
        pthread_mutex_unlock((pthread_mutex_t *)(piVar32 + 0xa0ba));
      }
    }
    if (!bVar51) break;
LAB_00116865:
    if (lVar34 == 0) break;
  }
LAB_001168fa:
  iVar21 = *(int *)((long)thread_func_param + 0xa0);
  pcVar47 = get_header(pmVar42,iVar21,"Transfer-Encoding");
  if (pcVar47 == (char *)0x0) {
LAB_00116953:
    pcVar47 = get_header(pmVar42,iVar21,"Content-Length");
    if (pcVar47 == (char *)0x0) {
      *(undefined8 *)((long)thread_func_param + 0x958) = 0;
    }
    else {
      portend = (char *)0x0;
      lVar31 = strtoll(pcVar47,&portend,10);
      *(longlong *)((long)thread_func_param + 0x958) = lVar31;
      if (lVar31 < 0 || portend == pcVar47) {
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s","Bad request");
        local_4284 = 0x19b;
        goto LAB_001158aa;
      }
      *(longlong *)((long)thread_func_param + 0x78) = lVar31;
    }
LAB_00116a5a:
    pcVar47 = *(char **)((long)thread_func_param + 0x30);
    iVar21 = strcmp(pcVar47,"1.0");
    if ((iVar21 != 0) && (iVar21 = strcmp(pcVar47,"1.1"), iVar21 != 0)) {
      mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"Bad HTTP version: [%s]",
                  pcVar47);
      iVar21 = 0x1f9;
LAB_001158b2:
      mg_send_http_error((mg_connection *)thread_func_param,iVar21,"%s");
    }
  }
  else {
    p_Var35 = *local_4270;
    lVar34 = 0;
    do {
      pbVar38 = (byte *)(pcVar47 + lVar34);
      pbVar1 = (byte *)("identity" + lVar34);
      if (*pbVar38 == 0) break;
      lVar34 = lVar34 + 1;
    } while (p_Var35[*pbVar38] == p_Var35[*pbVar1]);
    if (p_Var35[*pbVar38] == p_Var35[*pbVar1]) goto LAB_00116953;
    lVar34 = 0;
    do {
      pbVar38 = (byte *)(pcVar47 + lVar34);
      pbVar1 = (byte *)("chunked" + lVar34);
      if (*pbVar38 == 0) break;
      lVar34 = lVar34 + 1;
    } while (p_Var35[*pbVar38] == p_Var35[*pbVar1]);
    if (p_Var35[*pbVar38] == p_Var35[*pbVar1]) {
      *(undefined4 *)((long)thread_func_param + 0x968) = 1;
      *(undefined8 *)((long)thread_func_param + 0x958) = 0;
      goto LAB_00116a5a;
    }
    mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s","Bad request");
    local_4284 = 400;
LAB_001158aa:
    iVar21 = local_4284;
    if (0 < local_4284) goto LAB_001158b2;
  }
  if (ebuf[0] == '\0') {
    pcVar47 = *(char **)((long)thread_func_param + 0x18);
    cVar20 = *pcVar47;
    if (cVar20 == '\0') {
LAB_00115927:
      lVar34 = 0x18;
      pcVar44 = "http://";
      do {
        sVar9 = *(size_t *)((long)&http_methods[0x10].is_safe + lVar34);
        iVar21 = mg_strncasecmp(pcVar47,pcVar44,sVar9);
        if (iVar21 == 0) {
          pcVar44 = strchr(pcVar47 + sVar9,0x2f);
          iVar21 = 0;
          if (pcVar44 != (char *)0x0) {
            pcVar47 = strchr(pcVar47 + sVar9,0x3a);
            if (pcVar47 == (char *)0x0) {
              iVar21 = 3;
            }
            else {
              uVar45 = strtoul(pcVar47 + 1,&portend,10);
              iVar21 = 0;
              if (uVar45 != 0 && portend == pcVar44) {
                iVar21 = (uint)(uVar45 < 0x10000) << 2;
              }
            }
          }
          goto LAB_00115ae2;
        }
        pcVar44 = *(char **)((long)&abs_uri_protocols[0].proto + lVar34);
        lVar34 = lVar34 + 0x18;
      } while (lVar34 != 0x78);
      iVar21 = 0;
    }
    else {
      cVar36 = cVar20;
      pcVar44 = pcVar47;
      if ((cVar20 == '*') && (pcVar47[1] == '\0')) {
        iVar21 = 1;
      }
      else {
        do {
          if (cVar36 < '!') {
            iVar21 = 0;
            goto LAB_00115ae2;
          }
          cVar36 = pcVar44[1];
          pcVar44 = pcVar44 + 1;
        } while (cVar36 != '\0');
        iVar21 = 2;
        if (cVar20 != '/') goto LAB_00115927;
      }
    }
LAB_00115ae2:
    if (iVar21 - 3U < 2) {
      pcVar47 = *(char **)((long)thread_func_param + 0x18);
      lVar34 = 0;
      do {
        bVar4 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x100) + lVar34);
        iVar21 = (*local_4270)[bVar4];
        iVar23 = (*local_4270)[(byte)"yes"[lVar34]];
        if (bVar4 == 0) break;
        lVar34 = lVar34 + 1;
      } while (iVar21 == iVar23);
      lVar34 = 0x18;
      pcVar44 = "http://";
      do {
        sVar9 = *(size_t *)((long)&http_methods[0x10].is_safe + lVar34);
        iVar50 = mg_strncasecmp(pcVar47,pcVar44,sVar9);
        if (iVar50 == 0) {
          pcVar47 = pcVar47 + sVar9;
          pcVar44 = strchr(pcVar47,0x2f);
          if (pcVar44 == (char *)0x0) {
            pcVar29 = (char *)0x0;
            pmVar42 = local_4280;
            goto LAB_00115d91;
          }
          pcVar29 = strchr(pcVar47,0x3a);
          if (pcVar29 == (char *)0x0 || pcVar44 < pcVar29) {
            uVar41 = *(uint *)((long)&http_methods[0x10].is_cacheable + lVar34);
            uVar45 = (long)pcVar44 - (long)pcVar47;
            goto LAB_00115bf6;
          }
          uVar27 = strtoul(pcVar29 + 1,&portend,10);
          if (uVar27 - 0x10000 < 0xffffffffffff0001 || portend != pcVar44) goto LAB_00115d86;
          uVar45 = (long)pcVar29 - (long)pcVar47;
          goto LAB_00115bfd;
        }
        pcVar44 = *(char **)((long)&abs_uri_protocols[0].proto + lVar34);
        lVar34 = lVar34 + 0x18;
      } while (lVar34 != 0x78);
      uVar41 = 0;
      uVar45 = 0;
      pcVar47 = (char *)0x0;
      pcVar44 = (char *)0x0;
LAB_00115bf6:
      uVar27 = (ulong)uVar41;
LAB_00115bfd:
      pmVar42 = local_4280;
      if ((uVar27 == 0) ||
         (uVar27 != (ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                            *(ushort *)((long)thread_func_param + 0x8fe) >> 8))) {
LAB_00115d86:
        pcVar29 = (char *)0x0;
        pmVar42 = local_4280;
      }
      else {
        pcVar29 = pcVar44;
        if (iVar21 == iVar23) {
          local_4208 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8);
          sVar28 = strlen(local_4208);
          if ((pcVar47 == (char *)0x0) ||
             (((pcVar29 = (char *)0x0, sVar28 != 0 &&
               ((uVar45 != sVar28 ||
                (local_4210 = sVar28, iVar21 = bcmp(local_4208,pcVar47,sVar28), pcVar29 = pcVar44,
                sVar28 = local_4210, iVar21 != 0)))) &&
              ((uVar45 < sVar28 + 2 ||
               ((pcVar47[~sVar28 + uVar45] != '.' ||
                (iVar21 = bcmp(local_4208,pcVar47 + (uVar45 - sVar28),sVar28), pcVar29 = pcVar44,
                iVar21 != 0)))))))) {
            pcVar29 = (char *)0x0;
          }
        }
      }
    }
    else {
      if (iVar21 != 1) {
        if (iVar21 == 2) {
          pcVar29 = *(char **)((long)thread_func_param + 0x18);
          goto LAB_00115d91;
        }
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"Invalid URI");
        mg_send_http_error((mg_connection *)thread_func_param,400,"%s");
      }
      pcVar29 = (char *)0x0;
    }
LAB_00115d91:
    *(char **)((long)thread_func_param + 0x20) = pcVar29;
    *(char **)((long)thread_func_param + 0x28) = pcVar29;
  }
  if (ebuf[0] == '\0') {
    iVar21 = *(int *)((long)thread_func_param + 0xa0);
    uVar41 = 0;
    uVar22 = 0;
    if (0 < (long)iVar21) {
      p_Var35 = *local_4270;
      uVar45 = 0;
      uVar22 = 0;
      do {
        lVar34 = 0;
        do {
          iVar23 = p_Var35[(byte)"Connection"[lVar34]];
          iVar50 = p_Var35[(byte)pmVar42[uVar45].name[lVar34]];
          if ("Connection"[lVar34] == 0) break;
          lVar34 = lVar34 + 1;
        } while (iVar23 == iVar50);
        if (iVar23 == iVar50) {
          lVar34 = (long)(int)uVar22;
          uVar22 = uVar22 + 1;
          (&portend)[lVar34] = pmVar42[uVar45].value;
        }
        uVar45 = uVar45 + 1;
      } while ((uVar45 < (ulong)(long)iVar21) && ((int)uVar22 < 8));
    }
    if (0 < (int)uVar22) {
      uVar45 = 0;
      bVar51 = false;
      do {
        pcVar47 = mg_strcasestr((&portend)[uVar45],"upgrade");
        if (pcVar47 != (char *)0x0) {
          bVar51 = true;
        }
        uVar45 = uVar45 + 1;
      } while (uVar22 != uVar45);
      if (bVar51) {
        pcVar47 = mg_get_header((mg_connection *)thread_func_param,"Upgrade");
        if (pcVar47 == (char *)0x0) {
          uVar41 = 0xffffffff;
        }
        else {
          pcVar44 = mg_strcasestr(pcVar47,"websocket");
          uVar41 = 1;
          if (pcVar44 == (char *)0x0) {
            pcVar47 = mg_strcasestr(pcVar47,"h2");
            uVar41 = -(uint)(pcVar47 == (char *)0x0) | 2;
          }
        }
      }
      else {
        uVar41 = 0;
      }
    }
    if (uVar41 == 2) {
      uVar41 = 0;
    }
    p_Var35 = (__int32_t *)(ulong)uVar41;
    *(uint *)((long)thread_func_param + 4) = uVar41;
    if (*(long *)((long)thread_func_param + 0x28) != 0) {
      callback_handler = (mg_request_handler)0x0;
      handler_info = (mg_handler_info *)0x0;
      ws_connect_handler = (mg_websocket_connect_handler)0x0;
      ws_ready_handler = (mg_websocket_ready_handler)0x0;
      ws_data_handler = (mg_websocket_data_handler)0x0;
      ws_close_handler = (mg_websocket_close_handler)0x0;
      callback_data = (void *)0x0;
      auth_handler = (mg_authorization_handler)0x0;
      auth_callback_data = (void *)0x0;
      curtime = time((time_t *)0x0);
      path[0] = '\0';
      *(undefined4 *)((long)thread_func_param + 8) = 0;
      pcVar47 = strchr(*(char **)((long)thread_func_param + 0x18),0x3f);
      *(char **)((long)thread_func_param + 0x38) = pcVar47;
      if (pcVar47 != (char *)0x0) {
        p_Var35 = (__int32_t *)(pcVar47 + 1);
        *(__int32_t **)((long)thread_func_param + 0x38) = p_Var35;
        *pcVar47 = '\0';
      }
      if ((*(char *)((long)thread_func_param + 0x934) == '\0') &&
         (*(char *)((long)thread_func_param + 0x935) != '\0')) {
        lVar34 = *(long *)((long)thread_func_param + 0x8e0);
        uVar41 = 0xffffffff;
        if (lVar34 != 0) {
          uVar22 = 0;
          do {
            uVar37 = uVar22;
            uVar41 = 0xffffffff;
            if (*(uint *)(lVar34 + 0x18) == uVar37) break;
            uVar22 = uVar37 + 1;
            uVar41 = uVar37;
          } while (*(char *)(*(long *)(lVar34 + 8) + 0x3c + (ulong)uVar37 * 0x40) == '\0');
        }
        if ((int)uVar41 < 0) {
          pcVar47 = "Error: SSL forward not configured properly";
          mg_send_http_error((mg_connection *)thread_func_param,0x1f7,"%s");
          mg_cry_internal_wrap
                    ((mg_connection *)thread_func_param,(mg_context *)0x0,func_00,(uint)pcVar47,"%s"
                     ,"Can not redirect to SSL, no SSL port available");
        }
        else {
          uVar5 = *(ushort *)(*(long *)(lVar34 + 8) + 6 + (ulong)uVar41 * 0x40);
          pcVar47 = "https";
          if (*(int *)((long)thread_func_param + 4) == 1) {
            pcVar47 = "wss";
          }
          *(undefined4 *)((long)thread_func_param + 0x980) = 1;
          iVar21 = mg_construct_local_link
                             ((mg_connection *)thread_func_param,(char *)&portend,0x2000,pcVar47,
                              (uint)(ushort)(uVar5 << 8 | uVar5 >> 8),"yes");
          if (iVar21 < 0) {
LAB_00116572:
            pcVar47 = "Redirect URL too long";
            mg_send_http_error((mg_connection *)thread_func_param,500,"%s");
          }
          else {
            pcVar44 = *(char **)((long)thread_func_param + 0x38);
            if (pcVar44 != (char *)0x0) {
              sVar28 = strlen((char *)&portend);
              __n = strlen(pcVar44);
              if (0x1fff < __n + sVar28 + 2) goto LAB_00116572;
              *(undefined1 *)((long)&portend + sVar28) = 0x3f;
              pcVar47 = (char *)((long)&portend + 1);
              memcpy((byte *)((long)&((mg_match_context *)
                                     (((mg_match_context *)pcVar47)->match + -1))->case_sensitive +
                             sVar28),pcVar44,__n);
              *(undefined1 *)((long)&((vec *)&portend)->ptr + __n + sVar28 + 1) = 0;
            }
            mg_send_http_redirect((mg_connection *)thread_func_param,(char *)&portend,0x134);
          }
        }
      }
      else {
        if ((thread_func_param != (void *)0x0) && (*(long *)((long)thread_func_param + 0x8e8) != 0))
        {
          p_Var35 = *local_4270;
          lVar34 = 0;
          do {
            bVar4 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x70) + lVar34)
            ;
            pbVar38 = (byte *)("yes" + lVar34);
            if (bVar4 == 0) break;
            lVar34 = lVar34 + 1;
          } while (p_Var35[bVar4] == p_Var35[*pbVar38]);
          if (p_Var35[bVar4] == p_Var35[*pbVar38]) {
            pcVar47 = *(char **)((long)thread_func_param + 0x28);
            sVar28 = strlen(pcVar47);
            uVar41 = (int)sVar28 + 1;
            p_Var35 = (__int32_t *)(ulong)uVar41;
            mg_url_decode(pcVar47,(int)sVar28,pcVar47,uVar41,1);
          }
        }
        pcVar44 = *(char **)((long)thread_func_param + 0x38);
        pcVar47 = (char *)CONCAT71((int7)((ulong)p_Var35 >> 8),
                                   pcVar44 == (char *)0x0 || thread_func_param == (void *)0x0);
        if ((pcVar44 != (char *)0x0 && thread_func_param != (void *)0x0) &&
           (*(long *)((long)thread_func_param + 0x8e8) != 0)) {
          pcVar47 = (char *)*local_4270;
          lVar34 = 0;
          do {
            bVar4 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x78) + lVar34)
            ;
            iVar21 = *(int *)((long)&((mg_match_context *)
                                     (((mg_match_context *)pcVar47)->match + -1))->case_sensitive +
                             (ulong)bVar4 * 4);
            iVar23 = *(int *)((long)&((mg_match_context *)
                                     (((mg_match_context *)pcVar47)->match + -1))->case_sensitive +
                             (ulong)(byte)"yes"[lVar34] * 4);
            if (bVar4 == 0) break;
            lVar34 = lVar34 + 1;
          } while (iVar21 == iVar23);
          if (iVar21 == iVar23) {
            sVar28 = strlen(pcVar44);
            uVar41 = (int)sVar28 + 1;
            pcVar47 = (char *)(ulong)uVar41;
            mg_url_decode(pcVar44,(int)sVar28,pcVar44,uVar41,1);
          }
        }
        pcVar44 = *(char **)((long)thread_func_param + 0x20);
        sVar28 = strlen(pcVar44);
        pcVar44 = mg_strndup_ctx(pcVar44,sVar28,ctx);
        if (pcVar44 != (char *)0x0) {
          remove_dot_segments(pcVar44);
          *(char **)((long)thread_func_param + 0x28) = pcVar44;
          pcVar29 = next_option(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x50),
                                (vec *)&portend,&val);
          if (pcVar29 == (char *)0x0) {
            iVar21 = 0;
          }
          else {
            iVar21 = 0;
            mcx = (Elf64_Ehdr *)pcVar47;
            do {
              mult = ',';
              if (val.ptr != (char *)0x0) {
                mcx = (Elf64_Ehdr *)&mult;
                iVar23 = __isoc99_sscanf(val.ptr,"%lf%c",&file);
                if ((0 < iVar23) && (0.0 <= (double)file.stat.size)) {
                  mcx = (Elf64_Ehdr *)(ulong)(byte)mult;
                  iVar23 = (*local_4270)[(long)mcx];
                  if (iVar23 == 0x6b) {
                    dVar11 = 1024.0;
                  }
                  else {
                    if ((mult != ',') && (iVar23 != 0x6d)) goto LAB_00116258;
                    mcx = &Elf64_Ehdr_00100000;
                    iVar50 = 1;
                    if (iVar23 == 0x6d) {
                      iVar50 = 0x100000;
                    }
                    dVar11 = (double)iVar50;
                  }
                  file.stat.size = (uint64_t)((double)file.stat.size * dVar11);
                  if ((local_4030 == 1) && (*portend == '*')) {
                    iVar21 = (int)(double)file.stat.size;
                  }
                  else {
                    iVar23 = parse_match_net((vec *)&portend,local_4228,0);
                    if (iVar23 < 0) {
                      if ((portend != (char *)0x0) &&
                         (pVar30 = mg_match_alternatives
                                             (portend,local_4030,pcVar44,(mg_match_context *)mcx),
                         0 < pVar30)) goto LAB_0011630a;
                    }
                    else if (iVar23 != 0) {
LAB_0011630a:
                      iVar21 = (int)(double)file.stat.size;
                    }
                  }
                }
              }
LAB_00116258:
              pcVar29 = next_option(pcVar29,(vec *)&portend,&val);
              pcVar47 = (char *)mcx;
            } while (pcVar29 != (char *)0x0);
          }
          *(int *)((long)thread_func_param + 0x9a0) = iVar21;
          pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28310);
          if (pcVar8 == (code *)0x0) {
LAB_00116495:
            iVar21 = strcmp((char *)*puVar2,"OPTIONS");
            pmVar42 = local_4280;
            if (iVar21 != 0) {
LAB_001164b1:
              iVar21 = *(int *)((long)thread_func_param + 4);
              iVar23 = get_request_handler((mg_connection *)thread_func_param,0,&callback_handler,
                                           &subprotocols,&ws_connect_handler,&ws_ready_handler,
                                           &ws_data_handler,&ws_close_handler,
                                           (mg_authorization_handler *)0x0,&callback_data,
                                           &handler_info);
              if (iVar23 == 0) goto LAB_00116aee;
              bVar52 = iVar21 != 1;
              iVar21 = is_put_or_delete_method((mg_connection *)thread_func_param);
              bVar19 = true;
              pvVar24 = (void *)0x0;
              bVar51 = false;
              do {
                if (((int)pvVar24 != 0) &&
                   (**(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x118) != 'y')) {
LAB_00116dc2:
                  pcVar47 = *(char **)((long)thread_func_param + 0x10);
                  mg_send_http_error((mg_connection *)thread_func_param,0x195,
                                     "%s method not allowed");
                  goto LAB_00116fca;
                }
                pcVar47 = (char *)0x0;
                iVar23 = get_request_handler((mg_connection *)thread_func_param,2,
                                             (mg_request_handler *)0x0,
                                             (mg_websocket_subprotocols **)0x0,
                                             (mg_websocket_connect_handler *)0x0,
                                             (mg_websocket_ready_handler *)0x0,
                                             (mg_websocket_data_handler *)0x0,
                                             (mg_websocket_close_handler *)0x0,&auth_handler,
                                             &auth_callback_data,(mg_handler_info **)0x0);
                if (iVar23 != 0) {
                  iVar21 = (*auth_handler)((mg_connection *)thread_func_param,auth_callback_data);
                  if (iVar21 != 0) goto LAB_00116c7b;
LAB_00116fbd:
                  release_handler_ref((mg_connection *)thread_func_param,handler_info);
                  goto LAB_00116fca;
                }
                if (iVar21 != 0 && !bVar19) goto LAB_00116dc2;
                file.stat.is_directory = 0;
                file.stat.is_gzipped = 0;
                file.stat.location = 0;
                file.stat._28_4_ = 0;
                file.stat.size = 0;
                file.stat.last_modified = 0;
                file.access.fp = (FILE *)0x0;
                if ((thread_func_param == (void *)0x0) ||
                   (*(long *)((long)thread_func_param + 0x8e8) == 0)) {
LAB_00116fb3:
                  send_authorization_request((mg_connection *)thread_func_param,(char *)0x0);
                  goto LAB_00116fbd;
                }
                pcVar44 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf0);
                do {
                  pcVar44 = next_option(pcVar44,(vec *)&mult,&filename_vec);
                  filep = extraout_RDX_02;
                  if (pcVar44 == (char *)0x0) goto LAB_00116e73;
                  iVar21 = bcmp(*(void **)((long)thread_func_param + 0x28),
                                (void *)CONCAT71(uStack_41e7,mult),local_41e0);
                } while (iVar21 != 0);
                pcVar47 = (char *)0x1000;
                mg_snprintf((mg_connection *)thread_func_param,&local_4214,(char *)&val,0x1000,
                            "%.*s",(ulong)(uint)filename_vec.len,filename_vec.ptr);
                if ((local_4214 != 0) ||
                   (iVar21 = mg_fopen((mg_connection *)&val,(char *)0x1,(int)&file,
                                      (mg_file *)pcVar47), filep = extraout_RDX_04, iVar21 == 0)) {
                  piVar32 = __errno_location();
                  pcVar44 = strerror(*piVar32);
                  pcVar47 = (char *)&val;
                  mg_cry_internal_wrap
                            ((mg_connection *)thread_func_param,(mg_context *)0x0,func_01,
                             (uint)pcVar47,"%s: cannot open %s: %s","check_authorization",pcVar47,
                             pcVar44);
                  filep = extraout_RDX_03;
                }
LAB_00116e73:
                if ((file.access.fp == (FILE *)0x0) &&
                   (*(long *)((long)thread_func_param + 0x8e8) != 0)) {
                  pmVar46 = *(mg_connection **)(*(long *)((long)thread_func_param + 0x8e8) + 0x120);
                  if (pmVar46 == (mg_connection *)0x0) {
                    iVar21 = mg_stat((mg_connection *)path,(char *)&file,filep);
                    if ((iVar21 == 0) || (file.stat.is_directory == 0)) {
                      sVar28 = strlen(path);
                      uVar41 = (uint)sVar28;
                      pcVar47 = path + (sVar28 - 1);
                      do {
                        uVar41 = uVar41 - 1;
                        if (pcVar47 <= path) break;
                        cVar20 = *pcVar47;
                        pcVar47 = pcVar47 + -1;
                      } while (cVar20 != '/');
                      pcVar47 = (char *)0x1000;
                      mg_snprintf((mg_connection *)thread_func_param,&local_4274,(char *)&portend,
                                  0x1000,"%.*s/%s",(ulong)uVar41,path,".htpasswd");
                    }
                    else {
                      pcVar47 = (char *)0x1000;
                      mg_snprintf((mg_connection *)thread_func_param,&local_4274,(char *)&portend,
                                  0x1000,"%s/%s",path,".htpasswd");
                    }
                    pmVar46 = (mg_connection *)&portend;
                    if (local_4274 != 0) goto LAB_00116f7d;
                  }
                  mg_fopen(pmVar46,(char *)0x1,(int)&file,(mg_file *)pcVar47);
                }
LAB_00116f7d:
                if (file.access.fp != (FILE *)0x0) {
                  iVar21 = authorize((mg_connection *)thread_func_param,&file,(char *)0x0);
                  if (file.access.fp != (FILE *)0x0) {
                    fclose((FILE *)file.access.fp);
                  }
                  if (iVar21 == 0) goto LAB_00116fb3;
                }
LAB_00116c7b:
                if (bVar51) {
                  pcVar47 = "Not Found";
                  mg_send_http_error((mg_connection *)thread_func_param,0x194,"%s");
                  goto LAB_00116fca;
                }
                if (!bVar52) goto LAB_00116fca;
                iVar21 = (*callback_handler)((mg_connection *)thread_func_param,callback_data);
                release_handler_ref((mg_connection *)thread_func_param,handler_info);
                if (0 < iVar21) goto code_r0x00116e16;
                callback_handler = (mg_request_handler)0x0;
LAB_00116aee:
                path[0] = '\0';
                iVar21 = is_put_or_delete_method((mg_connection *)thread_func_param);
                if (thread_func_param == (void *)0x0) {
LAB_00116b9a:
                  pvVar24 = (void *)0x0;
                }
                else {
                  pcVar47 = (char *)*puVar2;
                  pvVar24 = thread_func_param;
                  if (pcVar47 != (char *)0x0) {
                    iVar23 = strcmp(pcVar47,"PROPFIND");
                    pvVar24 = (void *)0x1;
                    if ((((iVar23 != 0) && (iVar23 = strcmp(pcVar47,"PROPPATCH"), iVar23 != 0)) &&
                        (iVar23 = strcmp(pcVar47,"LOCK"), iVar23 != 0)) &&
                       ((iVar23 = strcmp(pcVar47,"UNLOCK"), iVar23 != 0 &&
                        (iVar23 = strcmp(pcVar47,"MOVE"), iVar23 != 0)))) {
                      iVar23 = strcmp(pcVar47,"COPY");
                      pvVar24 = (void *)(ulong)(iVar23 == 0);
                    }
                  }
                  if (pcVar47 == (char *)0x0) goto LAB_00116b9a;
                }
                *(undefined4 *)((long)thread_func_param + 0x984) = 0;
                pcVar47 = mg_get_header((mg_connection *)thread_func_param,"Accept-Encoding");
                bVar52 = true;
                if ((pcVar47 != (char *)0x0) &&
                   (pcVar47 = strstr(pcVar47,"gzip"), pcVar47 != (char *)0x0)) {
                  *(undefined4 *)((long)thread_func_param + 0x984) = 1;
                }
                bVar19 = false;
                bVar51 = true;
              } while( true );
            }
            pcVar47 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1a8);
            pcVar44 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b0);
            iVar21 = *(int *)((long)thread_func_param + 0xa0);
            pcVar40 = get_header(local_4280,iVar21,"Origin");
            pcVar29 = get_header(pmVar42,iVar21,"Access-Control-Request-Method");
            if (((pcVar44 == (char *)0x0) ||
                ((mg_match_context *)pcVar47 == (mg_match_context *)0x0 || *pcVar44 == '\0')) ||
               ((pcVar29 == (char *)0x0 || pcVar40 == (char *)0x0) ||
                *(byte *)&((mg_match_context *)pcVar47)->case_sensitive == 0)) goto LAB_001164b1;
            pcVar40 = get_header(local_4280,iVar21,"Access-Control-Request-Headers");
            gmt_time_string((char *)&portend,(size_t)&curtime,t);
            if (*pcVar44 != '*') {
              pcVar29 = pcVar44;
            }
            iVar21 = should_keep_alive((mg_connection *)thread_func_param);
            pcVar44 = "keep-alive";
            if (iVar21 == 0) {
              pcVar44 = "close";
            }
            mg_printf((mg_connection *)thread_func_param,
                      "HTTP/1.1 200 OK\r\nDate: %s\r\nAccess-Control-Allow-Origin: %s\r\nAccess-Control-Allow-Methods: %s\r\nContent-Length: 0\r\nConnection: %s\r\n"
                      ,&portend,pcVar47,pcVar29,pcVar44);
            if (((pcVar40 != (char *)0x0) &&
                (pcVar44 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b8),
                pcVar44 != (char *)0x0)) && (*pcVar44 != '\0')) {
              if (*pcVar44 == '*') {
                pcVar44 = pcVar40;
              }
              mg_printf((mg_connection *)thread_func_param,"Access-Control-Allow-Headers: %s\r\n",
                        pcVar44);
            }
            mg_printf((mg_connection *)thread_func_param,"Access-Control-Max-Age: 60\r\n");
            mg_printf((mg_connection *)thread_func_param,"\r\n");
          }
          else {
            iVar21 = (*pcVar8)(thread_func_param);
            if (iVar21 < 1) {
              if (iVar21 == 0) goto LAB_00116495;
            }
            else {
              *(int *)((long)thread_func_param + 0x99c) = iVar21;
              if (*(int *)((long)thread_func_param + 0x980) == 0) {
                do {
                  iVar21 = mg_read((mg_connection *)thread_func_param,(vec *)&portend,0x2000);
                } while (0 < iVar21);
              }
            }
          }
        }
      }
LAB_00116fca:
      pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28318);
      if (pcVar8 != (code *)0x0) {
        (*pcVar8)(thread_func_param);
      }
      if ((thread_func_param == (void *)0x0) || (*(long *)((long)thread_func_param + 0x8e8) == 0))
      goto LAB_00115dbe;
      portend = (char *)((ulong)portend & 0xffffffffffffff00);
      pmVar46 = *(mg_connection **)(*(long *)((long)thread_func_param + 0x8e8) + 0x88);
      if (pmVar46 == (mg_connection *)0x0) {
LAB_00117033:
        uVar41 = (uint)pcVar47;
        file.access.fp = (FILE *)0x0;
      }
      else {
        iVar21 = mg_fopen(pmVar46,(char *)0x4,(int)&file,(mg_file *)pcVar47);
        uVar41 = (uint)pcVar47;
        if (iVar21 == 0) goto LAB_00117033;
      }
      if ((file.access.fp != (FILE *)0x0) ||
         (*(long *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328) != 0)) {
        if ((char)portend == '\0') {
          __tp = localtime(local_41d0);
          if (__tp == (tm *)0x0) {
            cVar20 = '0';
            lVar34 = 0;
            do {
              *(char *)((long)&val.ptr + lVar34) = cVar20;
              cVar20 = "01/Jan/1970:00:00:00 +0000"[lVar34 + 1];
              lVar34 = lVar34 + 1;
            } while (lVar34 != 0x1a);
          }
          else {
            strftime((char *)&val,0x40,"%d/%b/%Y:%H:%M:%S %z",__tp);
          }
          sockaddr_to_string(path,0x32,local_4228);
          pcVar47 = mg_get_header((mg_connection *)thread_func_param,"Referer");
          if (pcVar47 == (char *)0x0) {
            pcVar47 = "-";
          }
          pcVar44 = mg_get_header((mg_connection *)thread_func_param,"User-Agent");
          if (pcVar44 == (char *)0x0) {
            pcVar44 = "-";
          }
          pcVar29 = *(char **)((long)thread_func_param + 0x40);
          if (pcVar29 == (char *)0x0) {
            pcVar29 = "-";
          }
          pcVar40 = *(char **)((long)thread_func_param + 0x10);
          pcVar48 = *(char **)((long)thread_func_param + 0x18);
          if (pcVar40 == (char *)0x0) {
            pcVar40 = "-";
          }
          if (pcVar48 == (char *)0x0) {
            pcVar48 = "-";
          }
          pcVar43 = *(char **)((long)thread_func_param + 0x38);
          pcVar49 = "?";
          if (pcVar43 == (char *)0x0) {
            pcVar49 = "";
            pcVar43 = "";
          }
          uVar41 = 0x1000;
          mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,(char *)&portend,0x1000,
                      "%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d %ld %s %s",path,pcVar29,&val,pcVar40,
                      pcVar48,pcVar49,pcVar43,*(undefined8 *)((long)thread_func_param + 0x30),
                      (ulong)*(uint *)((long)thread_func_param + 0x99c),
                      *(undefined8 *)((long)thread_func_param + 0x950),pcVar47,pcVar44);
        }
        pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328);
        if ((pcVar8 == (code *)0x0) || (iVar21 = (*pcVar8)(thread_func_param), iVar21 == 0)) {
          if (file.access.fp != (FILE *)0x0) {
            flockfile((FILE *)file.access.fp);
            bVar51 = false;
            iVar21 = fprintf((FILE *)file.access.fp,"%s\n",&portend);
            iVar23 = fflush((FILE *)file.access.fp);
            funlockfile((FILE *)file.access.fp);
            pcVar47 = extraout_RDX_05;
            if (file.access.fp != (FILE *)0x0) {
              iVar50 = fclose((FILE *)file.access.fp);
              bVar51 = iVar50 == 0;
              pcVar47 = extraout_RDX_06;
            }
            file.access.fp = (FILE *)0x0;
            if (!(bool)((0 < iVar21 && iVar23 == 0) & bVar51)) {
              mg_cry_internal_wrap
                        ((mg_connection *)thread_func_param,(mg_context *)0x0,pcVar47,uVar41,
                         "Error writing log file %s",
                         *(undefined8 *)(*(long *)((long)thread_func_param + 0x8e8) + 0x88));
            }
          }
        }
        else if (file.access.fp != (FILE *)0x0) {
          fclose((FILE *)file.access.fp);
          file.access.fp = (FILE *)0x0;
        }
      }
      goto LAB_00115dbe;
    }
  }
  else {
    *(undefined4 *)((long)thread_func_param + 4) = 0xffffffff;
  }
  *(undefined4 *)((long)thread_func_param + 0x980) = 1;
LAB_00115dbe:
  free_buffered_response_header_list((mg_connection *)thread_func_param);
  if (*(void **)((long)thread_func_param + 0x40) != (void *)0x0) {
    free(*(void **)((long)thread_func_param + 0x40));
    *(undefined8 *)((long)thread_func_param + 0x40) = 0;
  }
  if (((((*(int *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28) == 0) &&
        (iVar21 = should_keep_alive((mg_connection *)thread_func_param), iVar21 != 0)) &&
       (lVar34 = *(long *)((long)thread_func_param + 0x958), -1 < lVar34)) &&
      (0 < (long)*(int *)((long)thread_func_param + 0x994))) &&
     ((*(int *)((long)thread_func_param + 0x968) == 4 ||
      ((*(int *)((long)thread_func_param + 0x968) == 0 &&
       ((*(long *)((long)thread_func_param + 0x960) == lVar34 ||
        (lVar34 + *(int *)((long)thread_func_param + 0x994) <=
         (long)*(int *)((long)thread_func_param + 0x998))))))))) {
    bVar51 = *(int *)((long)thread_func_param + 4) == 0;
  }
  else {
    bVar51 = false;
  }
  if (bVar51) {
    lVar34 = (long)*(int *)((long)thread_func_param + 0x994) +
             *(long *)((long)thread_func_param + 0x958);
    iVar21 = *(int *)((long)thread_func_param + 0x998);
    iVar23 = (int)lVar34;
    if (iVar21 <= lVar34) {
      iVar23 = iVar21;
    }
    uVar41 = iVar21 - iVar23;
    *(uint *)((long)thread_func_param + 0x998) = uVar41;
    if (uVar41 != 0 && iVar23 <= iVar21) {
      memmove(*(void **)((long)thread_func_param + 0x970),
              (void *)((long)iVar23 + (long)*(void **)((long)thread_func_param + 0x970)),
              (ulong)uVar41);
    }
  }
  if (((*(int *)((long)thread_func_param + 0x998) < 0) ||
      (*(int *)((long)thread_func_param + 0x990) < *(int *)((long)thread_func_param + 0x998))) ||
     (*(int *)((long)thread_func_param + 0x98c) = *(int *)((long)thread_func_param + 0x98c) + 1,
     !bVar51)) goto LAB_001172b2;
  goto LAB_00115761;
code_r0x00116e16:
  *(int *)((long)thread_func_param + 0x99c) = iVar21;
  if (*(int *)((long)thread_func_param + 0x980) == 0) {
    do {
      iVar21 = mg_read((mg_connection *)thread_func_param,&portend,0x2000);
    } while (0 < iVar21);
  }
  goto LAB_00116fca;
LAB_001172b2:
  close_connection((mg_connection *)thread_func_param);
  __cond = local_41c8;
  __mutex = local_41c0;
  ctx_00 = local_41b8;
  goto LAB_00115556;
}

Assistant:

static void *
worker_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	worker_thread_run((struct mg_connection *)thread_func_param);
	return NULL;
}